

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * extraBddAndPermute(DdHashTable *table,DdManager *ddF,DdNode *bF,DdManager *ddG,DdNode *bG,
                           int *pPermute)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  DdNode *pDVar7;
  ulong uVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  timespec ts;
  timespec local_60;
  uint *local_50;
  uint *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar9 = (DdNode *)((ulong)ddF->one ^ 1);
  if (pDVar9 == bF) {
    return pDVar9;
  }
  if ((DdNode *)((ulong)ddG->one ^ 1) == bG) {
    return pDVar9;
  }
  if (ddG->one == bG) {
    return bF;
  }
  pDVar9 = cuddHashTableLookup2(table,bF,bG);
  if (pDVar9 == (DdNode *)0x0) {
    Counter = Counter + 1;
    if (ddF->TimeStop != 0) {
      iVar2 = clock_gettime(3,&local_60);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      if (ddF->TimeStop < lVar6) {
        return (DdNode *)0x0;
      }
    }
    if (ddG->TimeStop != 0) {
      iVar2 = clock_gettime(3,&local_60);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      if (ddG->TimeStop < lVar6) {
        return (DdNode *)0x0;
      }
    }
    local_48 = (uint *)((ulong)bF & 0xfffffffffffffffe);
    iVar2 = 0x7fffffff;
    if ((ulong)*local_48 != 0x7fffffff) {
      iVar2 = ddF->perm[*local_48];
    }
    local_50 = (uint *)((ulong)bG & 0xfffffffffffffffe);
    if (pPermute == (int *)0x0) {
      uVar4 = *local_50;
    }
    else {
      uVar4 = pPermute[*local_50];
    }
    iVar3 = 0x7fffffff;
    if (uVar4 != 0x7fffffff) {
      iVar3 = ddF->perm[uVar4];
    }
    iVar5 = iVar3;
    if (iVar2 < iVar3) {
      iVar5 = iVar2;
    }
    if (iVar5 < ddF->size) {
      pDVar9 = bF;
      local_38 = bF;
      if (iVar2 <= iVar3) {
        uVar8 = (ulong)((uint)bF & 1);
        pDVar9 = (DdNode *)(*(ulong *)(local_48 + 6) ^ uVar8);
        local_38 = (DdNode *)(uVar8 ^ *(ulong *)(local_48 + 4));
      }
      pDVar7 = bG;
      pDVar10 = bG;
      if (iVar3 <= iVar2) {
        uVar8 = (ulong)((uint)bG & 1);
        pDVar7 = (DdNode *)(*(ulong *)(local_50 + 6) ^ uVar8);
        pDVar10 = (DdNode *)(uVar8 ^ *(ulong *)(local_50 + 4));
      }
      local_40 = ddF->vars[ddF->invperm[iVar5]];
      pDVar9 = extraBddAndPermute(table,ddF,pDVar9,ddG,pDVar7,pPermute);
      if (pDVar9 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar7 = extraBddAndPermute(table,ddF,local_38,ddG,pDVar10,pPermute);
        if (pDVar7 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar10 = cuddBddIteRecur(ddF,local_40,pDVar7,pDVar9);
          if (pDVar10 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_IterDerefBdd(ddF,pDVar9);
            Cudd_IterDerefBdd(ddF,pDVar7);
            cuddHashTableInsert2(table,bF,bG,pDVar10,(ulong)local_50[1] * (ulong)local_48[1] + -1);
            piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return pDVar10;
          }
          Cudd_IterDerefBdd(ddF,pDVar9);
          pDVar9 = pDVar7;
        }
        Cudd_IterDerefBdd(ddF,pDVar9);
      }
      return (DdNode *)0x0;
    }
    __assert_fail("Lev < ddF->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                  ,0x88e,
                  "DdNode *extraBddAndPermute(DdHashTable *, DdManager *, DdNode *, DdManager *, DdNode *, int *)"
                 );
  }
  return pDVar9;
}

Assistant:

DdNode * extraBddAndPermute( DdHashTable * table, DdManager * ddF, DdNode * bF, DdManager * ddG, DdNode * bG, int * pPermute )
{
    DdNode * bF0, * bF1, * bG0, * bG1, * bRes0, * bRes1, * bRes, * bVar;
    int LevF, LevG, Lev;

    // if F == 0, return 0 
    if ( bF == Cudd_Not(ddF->one) )
        return Cudd_Not(ddF->one);
    // if G == 0, return 0 
    if ( bG == Cudd_Not(ddG->one) )
        return Cudd_Not(ddF->one);
    // if G == 1, return F
    if ( bG == ddG->one )
        return bF;
    // cannot use F == 1, because the var order of G has to be changed

    // check cache
    if ( //(Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1) && 
         (bRes = cuddHashTableLookup2(table, bF, bG)) )
        return bRes;
    Counter++;

    if ( ddF->TimeStop && Abc_Clock() > ddF->TimeStop )
        return NULL;
    if ( ddG->TimeStop && Abc_Clock() > ddG->TimeStop )
        return NULL;

    // find the topmost variable in F and G using var order of F
    LevF = cuddI( ddF, Cudd_Regular(bF)->index );
    LevG = cuddI( ddF, pPermute ? pPermute[Cudd_Regular(bG)->index] : Cudd_Regular(bG)->index );
    Lev  = Abc_MinInt( LevF, LevG );
    assert( Lev < ddF->size );
    bVar = ddF->vars[ddF->invperm[Lev]];

    // cofactor
    bF0 = (Lev < LevF) ? bF : Cudd_NotCond( cuddE(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bF1 = (Lev < LevF) ? bF : Cudd_NotCond( cuddT(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bG0 = (Lev < LevG) ? bG : Cudd_NotCond( cuddE(Cudd_Regular(bG)), Cudd_IsComplement(bG) );
    bG1 = (Lev < LevG) ? bG : Cudd_NotCond( cuddT(Cudd_Regular(bG)), Cudd_IsComplement(bG) );

    // call for cofactors
    bRes0 = extraBddAndPermute( table, ddF, bF0, ddG, bG0, pPermute );
    if ( bRes0 == NULL ) 
        return NULL;
    cuddRef( bRes0 );
    // call for cofactors
    bRes1 = extraBddAndPermute( table, ddF, bF1, ddG, bG1, pPermute );
    if ( bRes1 == NULL ) 
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        return NULL;
    }
    cuddRef( bRes1 );

    // compose the result
    bRes = cuddBddIteRecur( ddF, bVar, bRes1, bRes0 );
    if ( bRes == NULL )
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        Cudd_IterDerefBdd( ddF, bRes1 );
        return NULL;
    }
    cuddRef( bRes );
    Cudd_IterDerefBdd( ddF, bRes0 );
    Cudd_IterDerefBdd( ddF, bRes1 );

    // cache the result
//    if ( Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1 )
    {
        ptrint fanout = (ptrint)Cudd_Regular(bF)->ref * Cudd_Regular(bG)->ref;
        cuddSatDec(fanout);
        cuddHashTableInsert2( table, bF, bG, bRes, fanout );
    }
    cuddDeref( bRes );
    return bRes;
}